

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Prefs.cxx
# Opt level: O2

void __thiscall Fl_Tree_Prefs::Fl_Tree_Prefs(Fl_Tree_Prefs *this)

{
  Fl_Boxtype FVar1;
  int iVar2;
  
  this->_labelfont = 0;
  this->_labelsize = FL_NORMAL_SIZE;
  this->_margintop = 3;
  this->_marginleft = 6;
  this->_openchild_marginbottom = 0;
  this->_usericonmarginleft = 3;
  this->_labelmarginleft = 3;
  this->_connectorwidth = 0x11;
  this->_linespacing = 0;
  this->_labelfgcolor = 0x38;
  this->_labelbgcolor = 0xffffffff;
  this->_connectorcolor = 0x2b;
  this->_connectorstyle = FL_TREE_CONNECTOR_DOTTED;
  this->_openimage = &L_openpixmap.super_Fl_Image;
  this->_closeimage = &L_closepixmap.super_Fl_Image;
  this->_userimage = (Fl_Image *)0x0;
  this->_showcollapse = '\x01';
  this->_showroot = '\x01';
  this->_sortorder = FL_TREE_SORT_NONE;
  this->_selectbox = FL_FLAT_BOX;
  this->_selectmode = FL_TREE_SELECT_SINGLE;
  iVar2 = Fl::is_scheme("gtk+");
  if (iVar2 == 0) {
    iVar2 = Fl::is_scheme("plastic");
    if (iVar2 == 0) {
      return;
    }
    FVar1 = _FL_PLASTIC_THIN_UP_BOX;
  }
  else {
    FVar1 = _FL_GTK_THIN_UP_BOX;
  }
  this->_selectbox = FVar1;
  return;
}

Assistant:

Fl_Tree_Prefs::Fl_Tree_Prefs() {
  _labelfont              = FL_HELVETICA;
  _labelsize              = FL_NORMAL_SIZE;
  _marginleft             = 6;
  _margintop              = 3;
#if FLTK_ABI_VERSION >= 10301
  _marginbottom           = 20;
#endif /*FLTK_ABI_VERSION*/
  _openchild_marginbottom = 0;
  _usericonmarginleft     = 3;
  _labelmarginleft        = 3;
#if FLTK_ABI_VERSION >= 10301
  _widgetmarginleft       = 3;
#endif /*FLTK_ABI_VERSION*/
  _linespacing            = 0;
  _labelfgcolor           = FL_BLACK;
  _labelbgcolor           = 0xffffffff;		// we use this as 'transparent'
  _connectorcolor         = Fl_Color(43);
#ifdef __APPLE__
  _connectorstyle         = FL_TREE_CONNECTOR_NONE;
#else /* __APPLE__ */
  _connectorstyle         = FL_TREE_CONNECTOR_DOTTED;
#endif /* __APPLE__ */
  _openimage              = &L_openpixmap;
  _closeimage             = &L_closepixmap;
  _userimage              = 0;
#if FLTK_ABI_VERSION >= 10304
  _opendeimage = _openimage->copy();
  _opendeimage->inactive();
  _closedeimage = _closeimage->copy();
  _closedeimage->inactive();
  _userdeimage            = 0;
#endif
  _showcollapse           = 1;
  _showroot               = 1;
  _connectorwidth         = 17;
  _sortorder              = FL_TREE_SORT_NONE;
  _selectbox              = FL_FLAT_BOX;
  _selectmode             = FL_TREE_SELECT_SINGLE;
#if FLTK_ABI_VERSION >= 10301
  _itemreselectmode       = FL_TREE_SELECTABLE_ONCE;
  _itemdrawmode           = FL_TREE_ITEM_DRAW_DEFAULT;
#endif
#if FLTK_ABI_VERSION >= 10303
  _itemdrawcallback       = 0;
  _itemdrawuserdata       = 0;
#endif
  // Let fltk's current 'scheme' affect defaults
  if (Fl::is_scheme("gtk+")) {
    _selectbox = _FL_GTK_THIN_UP_BOX;
  } else if (Fl::is_scheme("plastic")) {
    _selectbox = _FL_PLASTIC_THIN_UP_BOX;
  }
}